

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O3

kvs_ops_stat * filemgr_migrate_op_stats(filemgr *old_file,filemgr *new_file,kvs_info *kvs)

{
  kvs_ops_stat *pkVar1;
  
  if (new_file == (filemgr *)0x0) {
    pkVar1 = (kvs_ops_stat *)0x0;
  }
  else {
    pthread_spin_lock(&old_file->lock);
    pkVar1 = &(new_file->header).op_stat;
    (new_file->header).op_stat.num_sets.super___atomic_base<unsigned_long>._M_i =
         (old_file->header).op_stat.num_sets.super___atomic_base<unsigned_long>._M_i;
    (new_file->header).op_stat.num_dels.super___atomic_base<unsigned_long>._M_i =
         (old_file->header).op_stat.num_dels.super___atomic_base<unsigned_long>._M_i;
    (new_file->header).op_stat.num_commits.super___atomic_base<unsigned_long>._M_i =
         (old_file->header).op_stat.num_commits.super___atomic_base<unsigned_long>._M_i;
    (new_file->header).op_stat.num_compacts.super___atomic_base<unsigned_long>._M_i =
         (old_file->header).op_stat.num_compacts.super___atomic_base<unsigned_long>._M_i;
    (new_file->header).op_stat.num_gets.super___atomic_base<unsigned_long>._M_i =
         (old_file->header).op_stat.num_gets.super___atomic_base<unsigned_long>._M_i;
    (new_file->header).op_stat.num_iterator_gets.super___atomic_base<unsigned_long>._M_i =
         (old_file->header).op_stat.num_iterator_gets.super___atomic_base<unsigned_long>._M_i;
    (new_file->header).op_stat.num_iterator_moves.super___atomic_base<unsigned_long>._M_i =
         (old_file->header).op_stat.num_iterator_moves.super___atomic_base<unsigned_long>._M_i;
    pthread_spin_unlock(&old_file->lock);
  }
  return pkVar1;
}

Assistant:

struct kvs_ops_stat *filemgr_migrate_op_stats(struct filemgr *old_file,
                                              struct filemgr *new_file,
                                              struct kvs_info *kvs)
{
    kvs_ops_stat *ret = NULL;
    if (new_file == NULL) {
        return NULL;
    }

    spin_lock(&old_file->lock);
    new_file->header.op_stat = old_file->header.op_stat;
    ret = &new_file->header.op_stat;
    spin_unlock(&old_file->lock);
    return ret;
}